

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

const_iterator * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::begin(const_iterator *__return_storage_ptr__,
       parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
       *this)

{
  iterator it;
  iterator local_50;
  
  local_50.it_ = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                 ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                          *)this);
  local_50.it_end_.ctrl_ =
       (this->sets_)._M_elems[0].set_.ctrl_ + (this->sets_)._M_elems[0].set_.capacity_;
  local_50.inner_ = (Inner *)this;
  local_50.inner_end_ = (Inner *)(this + 1);
  iterator::skip_empty(&local_50);
  (__return_storage_ptr__->iter_).it_end_.ctrl_ = local_50.it_end_.ctrl_;
  (__return_storage_ptr__->iter_).it_end_.field_1 = local_50.it_end_.field_1;
  (__return_storage_ptr__->iter_).it_.ctrl_ = local_50.it_.ctrl_;
  (__return_storage_ptr__->iter_).it_.field_1 = local_50.it_.field_1;
  (__return_storage_ptr__->iter_).inner_ = local_50.inner_;
  (__return_storage_ptr__->iter_).inner_end_ = local_50.inner_end_;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin()  const { return const_cast<parallel_hash_set *>(this)->begin(); }